

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void LockWheelingWindow(ImGuiWindow *window,float wheel_amount)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  ImGuiContext *g;
  char *local_28;
  
  pIVar1 = GImGui;
  if (in_RDI == (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowReleaseTimer = 0.0;
  }
  else {
    fVar3 = GImGui->WheelingWindowReleaseTimer;
    fVar2 = ImAbs(in_XMM0_Da);
    fVar3 = ImMin<float>(fVar2 * 0.7 + fVar3,0.7);
    pIVar1->WheelingWindowReleaseTimer = fVar3;
  }
  if (pIVar1->WheelingWindow != in_RDI) {
    if ((pIVar1->DebugLogFlags & 0x20U) != 0) {
      if (in_RDI == (ImGuiWindow *)0x0) {
        local_28 = "NULL";
      }
      else {
        local_28 = in_RDI->Name;
      }
      ImGui::DebugLog("LockWheelingWindow() \"%s\"\n",local_28);
    }
    pIVar1->WheelingWindow = in_RDI;
    pIVar1->WheelingWindowRefMousePos = (pIVar1->IO).MousePos;
  }
  return;
}

Assistant:

static void LockWheelingWindow(ImGuiWindow* window, float wheel_amount)
{
    ImGuiContext& g = *GImGui;
    if (window)
        g.WheelingWindowReleaseTimer = ImMin(g.WheelingWindowReleaseTimer + ImAbs(wheel_amount) * WINDOWS_MOUSE_WHEEL_SCROLL_LOCK_TIMER, WINDOWS_MOUSE_WHEEL_SCROLL_LOCK_TIMER);
    else
        g.WheelingWindowReleaseTimer = 0.0f;
    if (g.WheelingWindow == window)
        return;
    IMGUI_DEBUG_LOG_IO("LockWheelingWindow() \"%s\"\n", window ? window->Name : "NULL");
    g.WheelingWindow = window;
    g.WheelingWindowRefMousePos = g.IO.MousePos;
}